

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidx_manager.c
# Opt level: O0

opj_bool check_EPHuse(int coff,opj_marker_info_t *markers,int marknum,opj_cio_t *cio)

{
  int pos;
  uint uVar1;
  opj_cio_t *in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  uint Scod;
  int org_pos;
  int i;
  opj_bool EPHused;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_28;
  uint local_24;
  
  local_28 = 0;
  while( true ) {
    if (in_EDX <= local_28) {
      return 0;
    }
    if (*(short *)(in_RSI + (long)local_28 * 0x18) == -0xae) break;
    local_28 = local_28 + 1;
  }
  pos = cio_tell(in_RCX);
  cio_seek(in_RCX,in_EDI + (int)*(undefined8 *)(in_RSI + (long)local_28 * 0x18 + 8) + 2);
  uVar1 = cio_read((opj_cio_t *)CONCAT44(pos,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  local_24 = (uint)((uVar1 >> 2 & 1) != 0);
  cio_seek(in_RCX,pos);
  return local_24;
}

Assistant:

opj_bool check_EPHuse( int coff, opj_marker_info_t *markers, int marknum, opj_cio_t *cio)
{
  opj_bool EPHused = OPJ_FALSE;
  int i=0;
  int org_pos;
  unsigned int Scod;

  for(i = 0; i < marknum; i++){
    if( markers[i].type == J2K_MS_COD){
      org_pos = cio_tell( cio);
      cio_seek( cio, coff+markers[i].pos+2);
      
      Scod = cio_read( cio, 1);
      if( ((Scod >> 2) & 1))
	EPHused = OPJ_TRUE;
      cio_seek( cio, org_pos);

      break;
    }
  }    
  return EPHused;
}